

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_TEXM3X2TEX(Context *ctx)

{
  uint uVar1;
  char local_118 [4];
  int stage;
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  Context *ctx_local;
  
  if (ctx->texm3x2pad_src0 != -1) {
    uVar1 = (ctx->dest_arg).regnum;
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x2pad_src0,src1 + 0x38,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->texm3x2pad_dst0,src2 + 0x38,0x40);
    get_ARB1_varname_in_buf(ctx,REG_TYPE_ADDRESS,ctx->source_args[0].regnum,local_118,0x40);
    get_ARB1_destarg_varname(ctx,src0 + 0x38,0x40);
    output_line(ctx,"DP3 %s.y, %s, %s;",src0 + 0x38,local_118,src0 + 0x38);
    output_line(ctx,"DP3 %s.x, %s, %s;",src0 + 0x38,src1 + 0x38,src2 + 0x38);
    output_line(ctx,"TEX %s, %s, texture[%d], 2D;",src0 + 0x38,src0 + 0x38,(ulong)uVar1);
    emit_ARB1_dest_modifiers(ctx);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXM3X2TEX(Context *ctx)
{
    if (ctx->texm3x2pad_src0 == -1)
        return;

    char dst[64];
    char src0[64];
    char src1[64];
    char src2[64];

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    const int stage = ctx->dest_arg.regnum;
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_src0,
                            src0, sizeof (src0));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->texm3x2pad_dst0,
                            src1, sizeof (src1));
    get_ARB1_varname_in_buf(ctx, REG_TYPE_TEXTURE, ctx->source_args[0].regnum,
                            src2, sizeof (src2));
    get_ARB1_destarg_varname(ctx, dst, sizeof (dst));

    output_line(ctx, "DP3 %s.y, %s, %s;", dst, src2, dst);
    output_line(ctx, "DP3 %s.x, %s, %s;", dst, src0, src1);
    output_line(ctx, "TEX %s, %s, texture[%d], 2D;", dst, dst, stage);
    emit_ARB1_dest_modifiers(ctx);
}